

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O2

int kvtree_merge(kvtree *hash1,kvtree *hash2)

{
  kvtree_elem_struct *pkVar1;
  char *key;
  int iVar2;
  kvtree *pkVar3;
  int iVar4;
  
  if (hash1 == (kvtree *)0x0) {
    iVar4 = 1;
  }
  else if (hash2 == (kvtree *)0x0) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    while( true ) {
      pkVar1 = ((anon_struct_16_2_6a822a49_for_pointers *)hash2)->le_next;
      if (pkVar1 == (kvtree_elem_struct *)0x0) break;
      key = pkVar1->key;
      pkVar3 = kvtree_get(hash1,key);
      if (pkVar3 == (kvtree *)0x0) {
        pkVar3 = kvtree_new();
        pkVar3 = kvtree_set(hash1,key,pkVar3);
      }
      iVar2 = kvtree_merge(pkVar3,pkVar1->hash);
      if (iVar2 != 0) {
        iVar4 = 1;
      }
      hash2 = (kvtree *)&pkVar1->pointers;
    }
  }
  return iVar4;
}

Assistant:

int kvtree_merge(kvtree* hash1, const kvtree* hash2)
{
  /* need hash1 to be valid to insert anything into it */
  if (hash1 == NULL) {
    return KVTREE_FAILURE;
  }

  /* if hash2 is NULL, there is nothing to insert, so we're done */
  if (hash2 == NULL) {
    return KVTREE_SUCCESS;
  }

  int rc = KVTREE_SUCCESS;

  /* iterate over the elements in hash2 */
  kvtree_elem* elem;
  for (elem = kvtree_elem_first(hash2);
       elem != NULL;
       elem = kvtree_elem_next(elem))
  {
    /* get the key for this element */
    char* key = kvtree_elem_key(elem);

    /* get hash for the matching element in hash1, if it has one */
    kvtree* key_hash1 = kvtree_get(hash1, key);
    if (key_hash1 == NULL) {
      /* hash1 had no element with this key, so create one */
      key_hash1 = kvtree_set(hash1, key, kvtree_new());
    }

    /* merge the hash for this key from hash2 with the hash for this
     * key from hash1 */
    kvtree* key_hash2 = kvtree_elem_hash(elem);
    if (kvtree_merge(key_hash1, key_hash2) != KVTREE_SUCCESS) {
      rc = KVTREE_FAILURE;
    }
  }

  return rc;
}